

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O0

bool crnlib::create_compressed_texture
               (crn_comp_params *params,vector<unsigned_char> *comp_data,
               uint32 *pActual_quality_level,float *pActual_bitrate)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float fVar4;
  double dVar5;
  double dVar6;
  float local_804;
  int local_800;
  float bitrate;
  int quality;
  float bracket_high_bitrate;
  float bracket_low_bitrate;
  int bracket_high;
  int bracket_low;
  int trial_quality;
  float fStack_7e0;
  bool force_binary_search;
  uint iter_count;
  float highest_bitrate;
  int i;
  float cached_bitrates [256];
  uint local_3d0;
  uint local_3cc;
  int high_quality;
  int low_quality;
  uint cMaxIterations;
  int best_quality_level;
  float best_bitrate;
  int cNumQualityLevels;
  int cHighestQuality;
  int cLowestQuality;
  itexture_comp *pTexture_comp;
  crn_comp_params local_params;
  float *pActual_bitrate_local;
  uint32 *pActual_quality_level_local;
  vector<unsigned_char> *comp_data_local;
  crn_comp_params *params_local;
  
  local_params.m_pProgress_func_data = pActual_bitrate;
  memcpy(&pTexture_comp,params,0x378);
  bVar1 = pixel_format_helpers::is_crn_format_non_srgb(local_params._16_8_);
  if ((bVar1) &&
     (bVar1 = crn_comp_params::get_flag((crn_comp_params *)&pTexture_comp,cCRNCompFlagPerceptual),
     bVar1)) {
    console::info("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");
    crn_comp_params::set_flag((crn_comp_params *)&pTexture_comp,cCRNCompFlagPerceptual,false);
  }
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  if (local_params.m_pProgress_func_data != (void *)0x0) {
    *(undefined4 *)local_params.m_pProgress_func_data = 0;
  }
  vector<unsigned_char>::resize(comp_data,0,false);
  _cHighestQuality = create_texture_comp(pTexture_comp._4_4_);
  if (_cHighestQuality == (itexture_comp *)0x0) {
    params_local._7_1_ = false;
  }
  else {
    uVar2 = (*_cHighestQuality->_vptr_itexture_comp[3])(_cHighestQuality,&pTexture_comp);
    if ((uVar2 & 1) == 0) {
      crnlib_delete<crnlib::itexture_comp>(_cHighestQuality);
      params_local._7_1_ = false;
    }
    else if (((local_params.m_pImages[5][0xf]._0_4_ <= 0.0) || (local_params._16_8_ == 1)) ||
            ((pTexture_comp._4_4_ == cCRNFileTypeCRN &&
             (((undefined4)local_params.m_format & 0x40) != cCRNFmtDXT1)))) {
      if ((pTexture_comp._4_4_ == cCRNFileTypeCRN) ||
         ((pTexture_comp._4_4_ == cCRNFileTypeDDS && (local_params.m_pImages[5][0xf]._4_4_ < 0xff)))
         ) {
        console::info("Compressing using quality level %i",
                      (ulong)local_params.m_pImages[5][0xf]._4_4_);
      }
      if (local_params._16_8_ == 1) {
        if (pTexture_comp._4_4_ == cCRNFileTypeCRN) {
          console::warning("CRN format doesn\'t support DXT3");
        }
        else if ((pTexture_comp._4_4_ == cCRNFileTypeDDS) &&
                (local_params.m_pImages[5][0xf]._4_4_ < 0xff)) {
          console::warning("Clustered DDS compressor doesn\'t support DXT3");
        }
      }
      uVar2 = (*_cHighestQuality->_vptr_itexture_comp[4])
                        (_cHighestQuality,&pTexture_comp,local_params.m_pProgress_func_data);
      if ((uVar2 & 1) == 0) {
        crnlib_delete<crnlib::itexture_comp>(_cHighestQuality);
        params_local._7_1_ = false;
      }
      else {
        iVar3 = (*_cHighestQuality->_vptr_itexture_comp[7])();
        vector<unsigned_char>::swap(comp_data,(vector<unsigned_char> *)CONCAT44(extraout_var,iVar3))
        ;
        if ((pActual_quality_level != (uint32 *)0x0) &&
           (local_params.m_pImages[5][0xf]._0_4_ <= 0.0)) {
          *pActual_quality_level = local_params.m_pImages[5][0xf]._4_4_;
        }
        crnlib_delete<crnlib::itexture_comp>(_cHighestQuality);
        params_local._7_1_ = true;
      }
    }
    else {
      cMaxIterations = 0x501502f9;
      low_quality = -1;
      do {
        local_3cc = 0;
        local_3d0 = 0xff;
        for (iter_count = 0; (int)iter_count < 0x100; iter_count = iter_count + 1) {
          (&highest_bitrate)[(int)iter_count] = -1.0;
        }
        fStack_7e0 = 0.0;
        trial_quality = 0;
        bracket_low._3_1_ = 0;
        while ((int)local_3cc <= (int)local_3d0) {
          if ((params->m_flags & 0x80000000) != 0) {
            console::debug("Quality level bracket: [%u, %u]",(ulong)local_3cc,(ulong)local_3d0);
          }
          bracket_high = (int)(local_3cc + local_3d0) / 2;
          if ((trial_quality != 0) && (fVar4 = (float)bracket_high, (bracket_low._3_1_ & 1) == 0)) {
            while (bracket_low_bitrate = fVar4,
                  ((&highest_bitrate)[(int)bracket_low_bitrate] <= 0.0 &&
                  (&highest_bitrate)[(int)bracket_low_bitrate] != 0.0) &&
                  0 < (int)bracket_low_bitrate) {
              fVar4 = (float)((int)bracket_low_bitrate + -1);
            }
            if (0.0 < (&highest_bitrate)[(int)bracket_low_bitrate] ||
                (&highest_bitrate)[(int)bracket_low_bitrate] == 0.0) {
              bracket_high_bitrate = (float)(bracket_high + 1);
              if ((int)bracket_high_bitrate < 0x100) {
                for (; ((&highest_bitrate)[(int)bracket_high_bitrate] <= 0.0 &&
                       (&highest_bitrate)[(int)bracket_high_bitrate] != 0.0) &&
                       (int)bracket_high_bitrate < 0xff;
                    bracket_high_bitrate = (float)((int)bracket_high_bitrate + 1)) {
                }
                if (0.0 <= (&highest_bitrate)[(int)bracket_high_bitrate]) {
                  quality = (int)(&highest_bitrate)[(int)bracket_low_bitrate];
                  bitrate = (&highest_bitrate)[(int)bracket_high_bitrate];
                  if (((((float)quality < bitrate) &&
                       ((float)quality < local_params.m_pImages[5][0xf]._0_4_)) &&
                      (local_params.m_pImages[5][0xf]._0_4_ <= bitrate)) &&
                     ((local_800 = local_3cc +
                                   (int)(((local_params.m_pImages[5][0xf]._0_4_ - (float)quality) *
                                         (float)(int)(local_3d0 - local_3cc)) /
                                        (bitrate - (float)quality)), (int)local_3cc <= local_800 &&
                      (local_800 <= (int)local_3d0)))) {
                    bracket_high = local_800;
                  }
                }
              }
            }
            else {
              fVar4 = math::lerp<float,float>((float)(int)local_3cc,(float)(int)local_3d0,0.33);
              bracket_high = (int)fVar4;
            }
          }
          console::info("Compressing to quality level %u",(ulong)(uint)bracket_high);
          local_804 = 0.0;
          local_params.m_pImages[5][0xf]._4_4_ = bracket_high;
          uVar2 = (*_cHighestQuality->_vptr_itexture_comp[4])
                            (_cHighestQuality,&pTexture_comp,&local_804);
          if ((uVar2 & 1) == 0) {
            crnlib_delete<crnlib::itexture_comp>(_cHighestQuality);
            return false;
          }
          (&highest_bitrate)[bracket_high] = local_804;
          fStack_7e0 = math::maximum<float>(fStack_7e0,local_804);
          console::info("\nTried quality level %u, bpp: %3.3f",(double)local_804,
                        (ulong)(uint)bracket_high);
          if ((low_quality < 0) ||
             ((local_804 <= local_params.m_pImages[5][0xf]._0_4_ &&
              (local_params.m_pImages[5][0xf]._0_4_ < (float)cMaxIterations)))) {
LAB_00175fc3:
            fVar4 = local_804;
            cMaxIterations = (uint)local_804;
            iVar3 = (*_cHighestQuality->_vptr_itexture_comp[7])();
            vector<unsigned_char>::swap
                      (comp_data,(vector<unsigned_char> *)CONCAT44(extraout_var_00,iVar3));
            low_quality = bracket_high;
            if ((params->m_flags & 0x80000000) != 0) {
              console::debug("Choose new best quality level");
            }
            if ((fVar4 <= local_params.m_pImages[5][0xf]._0_4_) &&
               (dVar5 = std::fabs((double)(ulong)(uint)(fVar4 - local_params.m_pImages[5][0xf]._0_4_
                                                       )), SUB84(dVar5,0) < 0.005)) break;
          }
          else if ((local_804 <= local_params.m_pImages[5][0xf]._0_4_) ||
                  (local_params.m_pImages[5][0xf]._0_4_ < (float)cMaxIterations)) {
            dVar5 = std::fabs((double)(ulong)(uint)(local_804 - local_params.m_pImages[5][0xf]._0_4_
                                                   ));
            dVar6 = std::fabs((double)(ulong)(uint)((float)cMaxIterations -
                                                   local_params.m_pImages[5][0xf]._0_4_));
            if (SUB84(dVar5,0) < SUB84(dVar6,0)) goto LAB_00175fc3;
          }
          if (local_804 <= local_params.m_pImages[5][0xf]._0_4_) {
            local_3cc = bracket_high + 1;
          }
          else {
            local_3d0 = bracket_high - 1;
          }
          trial_quality = trial_quality + 1;
          if (8 < (uint)trial_quality) {
            bracket_low._3_1_ = 1;
          }
        }
        if (((((undefined4)local_params.m_format & cCRNFmtDXT5) == cCRNFmtDXT1) ||
            (local_params.m_pImages[5][0xf]._0_4_ <= fStack_7e0)) ||
           (dVar5 = std::fabs((double)(ulong)(uint)((float)cMaxIterations -
                                                   local_params.m_pImages[5][0xf]._0_4_)),
           SUB84(dVar5,0) < 0.005)) {
          crnlib_delete<crnlib::itexture_comp>(_cHighestQuality);
          if (low_quality < 0) {
            return false;
          }
          if (pActual_quality_level != (uint32 *)0x0) {
            *pActual_quality_level = low_quality;
          }
          if (local_params.m_pProgress_func_data != (void *)0x0) {
            *(uint *)local_params.m_pProgress_func_data = cMaxIterations;
          }
          console::printf("Selected quality level %u bpp: %f",(double)(float)cMaxIterations,
                          (ulong)(uint)low_quality);
          return true;
        }
        console::info(
                     "Unable to achieve desired bitrate - disabling adaptive block sizes and retrying search."
                     );
        local_params.m_format._0_4_ = (undefined4)local_params.m_format & 0xfffffffd;
        crnlib_delete<crnlib::itexture_comp>(_cHighestQuality);
        _cHighestQuality = create_texture_comp(pTexture_comp._4_4_);
        uVar2 = (*_cHighestQuality->_vptr_itexture_comp[3])(_cHighestQuality,&pTexture_comp);
      } while ((uVar2 & 1) != 0);
      crnlib_delete<crnlib::itexture_comp>(_cHighestQuality);
      params_local._7_1_ = false;
    }
  }
  return params_local._7_1_;
}

Assistant:

bool create_compressed_texture(const crn_comp_params& params, crnlib::vector<uint8>& comp_data, uint32* pActual_quality_level, float* pActual_bitrate)
    {
        crn_comp_params local_params(params);

        if (pixel_format_helpers::is_crn_format_non_srgb(local_params.m_format))
        {
            if (local_params.get_flag(cCRNCompFlagPerceptual))
            {
                console::info("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");

                // Destination compressed pixel format is swizzled or not RGB at all, so be sure perceptual colorspace metrics are disabled.
                local_params.set_flag(cCRNCompFlagPerceptual, false);
            }
        }

        if (pActual_quality_level)
        {
            *pActual_quality_level = 0;
        }
        if (pActual_bitrate)
        {
            *pActual_bitrate = 0.0f;
        }

        comp_data.resize(0);

        itexture_comp* pTexture_comp = create_texture_comp(local_params.m_file_type);
        if (!pTexture_comp)
        {
            return false;
        }

        if (!pTexture_comp->compress_init(local_params))
        {
            crnlib_delete(pTexture_comp);
            return false;
        }

        if ((local_params.m_target_bitrate <= 0.0f) || (local_params.m_format == cCRNFmtDXT3) || ((local_params.m_file_type == cCRNFileTypeCRN) && ((local_params.m_flags & cCRNCompFlagManualPaletteSizes) != 0)))
        {
            if ((local_params.m_file_type == cCRNFileTypeCRN) || ((local_params.m_file_type == cCRNFileTypeDDS) && (local_params.m_quality_level < cCRNMaxQualityLevel)))
            {
                console::info("Compressing using quality level %i", local_params.m_quality_level);
            }
            if (local_params.m_format == cCRNFmtDXT3)
            {
                if (local_params.m_file_type == cCRNFileTypeCRN)
                {
                    console::warning("CRN format doesn't support DXT3");
                }
                else if ((local_params.m_file_type == cCRNFileTypeDDS) && (local_params.m_quality_level < cCRNMaxQualityLevel))
                {
                    console::warning("Clustered DDS compressor doesn't support DXT3");
                }
            }
            if (!pTexture_comp->compress_pass(local_params, pActual_bitrate))
            {
                crnlib_delete(pTexture_comp);
                return false;
            }

            comp_data.swap(pTexture_comp->get_comp_data());

            if ((pActual_quality_level) && (local_params.m_target_bitrate <= 0.0))
            {
                *pActual_quality_level = local_params.m_quality_level;
            }

            crnlib_delete(pTexture_comp);
            return true;
        }

        // Interpolative search to find closest quality level to target bitrate.
        const int cLowestQuality = 0;
        const int cHighestQuality = cCRNMaxQualityLevel;
        const int cNumQualityLevels = cHighestQuality - cLowestQuality + 1;

        float best_bitrate = 1e+10f;
        int best_quality_level = -1;
        const uint cMaxIterations = 8;

        for (;;)
        {
            int low_quality = cLowestQuality;
            int high_quality = cHighestQuality;

            float cached_bitrates[cNumQualityLevels];
            for (int i = 0; i < cNumQualityLevels; i++)
            {
                cached_bitrates[i] = -1.0f;
            }

            float highest_bitrate = 0.0f;

            uint iter_count = 0;
            bool force_binary_search = false;

            while (low_quality <= high_quality)
            {
                if (params.m_flags & cCRNCompFlagDebugging)
                {
                    console::debug("Quality level bracket: [%u, %u]", low_quality, high_quality);
                }

                int trial_quality = (low_quality + high_quality) / 2;

                if ((iter_count) && (!force_binary_search))
                {
                    int bracket_low = trial_quality;
                    while ((cached_bitrates[bracket_low] < 0) && (bracket_low > cLowestQuality))
                    {
                        bracket_low--;
                    }

                    if (cached_bitrates[bracket_low] < 0)
                    {
                        trial_quality = static_cast<int>(math::lerp<float>((float)low_quality, (float)high_quality, .33f));
                    }
                    else
                    {
                        int bracket_high = trial_quality + 1;
                        if (bracket_high <= cHighestQuality)
                        {
                            while ((cached_bitrates[bracket_high] < 0) && (bracket_high < cHighestQuality))
                            {
                                bracket_high++;
                            }

                            if (cached_bitrates[bracket_high] >= 0)
                            {
                                float bracket_low_bitrate = cached_bitrates[bracket_low];
                                float bracket_high_bitrate = cached_bitrates[bracket_high];

                                if ((bracket_low_bitrate < bracket_high_bitrate) &&
                                    (bracket_low_bitrate < local_params.m_target_bitrate) &&
                                    (bracket_high_bitrate >= local_params.m_target_bitrate))
                                {
                                    int quality = low_quality + static_cast<int>(((local_params.m_target_bitrate - bracket_low_bitrate) * (high_quality - low_quality)) / (bracket_high_bitrate - bracket_low_bitrate));

                                    if ((quality >= low_quality) && (quality <= high_quality))
                                    {
                                        trial_quality = quality;
                                    }
                                }
                            }
                        }
                    }
                }

                console::info("Compressing to quality level %u", trial_quality);

                float bitrate = 0.0f;

                local_params.m_quality_level = trial_quality;

                if (!pTexture_comp->compress_pass(local_params, &bitrate))
                {
                    crnlib_delete(pTexture_comp);
                    return false;
                }

                cached_bitrates[trial_quality] = bitrate;

                highest_bitrate = math::maximum(highest_bitrate, bitrate);

                console::info("\nTried quality level %u, bpp: %3.3f", trial_quality, bitrate);

                if ((best_quality_level < 0) ||
                    ((bitrate <= local_params.m_target_bitrate) && (best_bitrate > local_params.m_target_bitrate)) ||
                    (((bitrate <= local_params.m_target_bitrate) || (best_bitrate > local_params.m_target_bitrate)) && (fabs(bitrate - local_params.m_target_bitrate) < fabs(best_bitrate - local_params.m_target_bitrate))))
                {
                    best_bitrate = bitrate;
                    comp_data.swap(pTexture_comp->get_comp_data());
                    best_quality_level = trial_quality;
                    if (params.m_flags & cCRNCompFlagDebugging)
                    {
                        console::debug("Choose new best quality level");
                    }

                    if ((best_bitrate <= local_params.m_target_bitrate) && (fabs(best_bitrate - local_params.m_target_bitrate) < .005f))
                    {
                        break;
                    }
                }

                if (bitrate > local_params.m_target_bitrate)
                {
                    high_quality = trial_quality - 1;
                }
                else
                {
                    low_quality = trial_quality + 1;
                }

                iter_count++;
                if (iter_count > cMaxIterations)
                {
                    force_binary_search = true;
                }
            }

            if (((local_params.m_flags & cCRNCompFlagHierarchical) != 0) &&
                (highest_bitrate < local_params.m_target_bitrate) &&
                (fabs(best_bitrate - local_params.m_target_bitrate) >= .005f))
            {
                console::info("Unable to achieve desired bitrate - disabling adaptive block sizes and retrying search.");

                local_params.m_flags &= ~cCRNCompFlagHierarchical;

                crnlib_delete(pTexture_comp);
                pTexture_comp = create_texture_comp(local_params.m_file_type);

                if (!pTexture_comp->compress_init(local_params))
                {
                    crnlib_delete(pTexture_comp);
                    return false;
                }
            }
            else
            {
                break;
            }
        }

        crnlib_delete(pTexture_comp);
        pTexture_comp = nullptr;

        if (best_quality_level < 0)
        {
            return false;
        }

        if (pActual_quality_level)
        {
            *pActual_quality_level = best_quality_level;
        }
        if (pActual_bitrate)
        {
            *pActual_bitrate = best_bitrate;
        }

        console::printf("Selected quality level %u bpp: %f", best_quality_level, best_bitrate);

        return true;
    }